

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct32_stage4_avx2(__m256i *bf1,__m256i *cospim8,__m256i *cospi56,__m256i *cospi8,
                       __m256i *cospim56,__m256i *cospim40,__m256i *cospi24,__m256i *cospi40,
                       __m256i *cospim24,__m256i *rounding,int bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [16];
  
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x11],(undefined1  [32])*cospim8);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1e],(undefined1  [32])*cospi56);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpmulld_avx2((undefined1  [32])*cospi56,(undefined1  [32])bf1[0x11]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1e],(undefined1  [32])*cospi8);
  auVar1 = vpaddd_avx2((undefined1  [32])*rounding,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  bf1[0x1e] = alVar4;
  bf1[0x11] = alVar3;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x12],(undefined1  [32])*cospim56);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1d],(undefined1  [32])*cospim8);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  auVar5 = ZEXT416((uint)bit);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  auVar1 = vpmulld_avx2((undefined1  [32])*cospim8,(undefined1  [32])bf1[0x12]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1d],(undefined1  [32])*cospi56);
  auVar1 = vpaddd_avx2((undefined1  [32])*rounding,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  bf1[0x1d] = alVar4;
  bf1[0x12] = alVar3;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x15],(undefined1  [32])*cospim40);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])*cospi24);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  auVar1 = vpmulld_avx2((undefined1  [32])*cospi24,(undefined1  [32])bf1[0x15]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])*cospi40);
  auVar1 = vpaddd_avx2((undefined1  [32])*rounding,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  bf1[0x1a] = alVar4;
  bf1[0x15] = alVar3;
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x16],(undefined1  [32])*cospim24);
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x19],(undefined1  [32])*cospim40);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpmulld_avx2((undefined1  [32])*cospim40,(undefined1  [32])bf1[0x16]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x19],(undefined1  [32])*cospi24);
  auVar1 = vpaddd_avx2((undefined1  [32])*rounding,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  bf1[0x19] = alVar4;
  bf1[0x16] = alVar3;
  return;
}

Assistant:

static inline void idct32_stage4_avx2(
    __m256i *bf1, const __m256i *cospim8, const __m256i *cospi56,
    const __m256i *cospi8, const __m256i *cospim56, const __m256i *cospim40,
    const __m256i *cospi24, const __m256i *cospi40, const __m256i *cospim24,
    const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  temp1 = half_btf_avx2(cospim8, &bf1[17], cospi56, &bf1[30], rounding, bit);
  bf1[30] = half_btf_avx2(cospi56, &bf1[17], cospi8, &bf1[30], rounding, bit);
  bf1[17] = temp1;

  temp2 = half_btf_avx2(cospim56, &bf1[18], cospim8, &bf1[29], rounding, bit);
  bf1[29] = half_btf_avx2(cospim8, &bf1[18], cospi56, &bf1[29], rounding, bit);
  bf1[18] = temp2;

  temp1 = half_btf_avx2(cospim40, &bf1[21], cospi24, &bf1[26], rounding, bit);
  bf1[26] = half_btf_avx2(cospi24, &bf1[21], cospi40, &bf1[26], rounding, bit);
  bf1[21] = temp1;

  temp2 = half_btf_avx2(cospim24, &bf1[22], cospim40, &bf1[25], rounding, bit);
  bf1[25] = half_btf_avx2(cospim40, &bf1[22], cospi24, &bf1[25], rounding, bit);
  bf1[22] = temp2;
}